

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

Type __thiscall
wasm::TypeBuilder::getTempRefType(TypeBuilder *this,HeapType type,Nullability nullable)

{
  type_t tVar1;
  TypeInfo local_30;
  
  local_30.isTemp = false;
  local_30.kind = RefKind;
  local_30.field_2.ref.heapType.id = (HeapType)type.id;
  local_30.field_2.ref.nullable = nullable;
  tVar1 = anon_unknown_0::Store<wasm::(anonymous_namespace)::TypeInfo>::insert
                    (&((this->impl)._M_t.
                       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)->
                      typeStore,&local_30);
  if (6 < tVar1.id) {
    *(undefined1 *)tVar1.id = 1;
  }
  anon_unknown_0::TypeInfo::~TypeInfo(&local_30);
  return (Type)tVar1.id;
}

Assistant:

Type TypeBuilder::getTempRefType(HeapType type, Nullability nullable) {
  return markTemp(impl->typeStore.insert(TypeInfo(type, nullable)));
}